

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASValue.cpp
# Opt level: O2

vector<ASValue_*,_std::allocator<ASValue_*>_> * __thiscall
ASValue::getOperandsWithOp2
          (vector<ASValue_*,_std::allocator<ASValue_*>_> *__return_storage_ptr__,ASValue *this)

{
  ASOperand2 *this_00;
  ASValue *pAVar1;
  pointer ppAVar2;
  ASValue *local_50;
  _Vector_base<ASValue_*,_std::allocator<ASValue_*>_> local_48;
  
  (__return_storage_ptr__->super__Vector_base<ASValue_*,_std::allocator<ASValue_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<ASValue_*,_std::allocator<ASValue_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<ASValue_*,_std::allocator<ASValue_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<ASValue_*,_std::allocator<ASValue_*>_>::vector
            ((vector<ASValue_*,_std::allocator<ASValue_*>_> *)&local_48,&this->_operands);
  ppAVar2 = local_48._M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppAVar2 == local_48._M_impl.super__Vector_impl_data._M_finish) {
      std::_Vector_base<ASValue_*,_std::allocator<ASValue_*>_>::~_Vector_base(&local_48);
      return __return_storage_ptr__;
    }
    if (*ppAVar2 == (ASValue *)0x0) {
LAB_0016b0c3:
      local_50 = (ASValue *)0x0;
      std::vector<ASValue*,std::allocator<ASValue*>>::emplace_back<ASValue*>
                ((vector<ASValue*,std::allocator<ASValue*>> *)__return_storage_ptr__,&local_50);
    }
    else {
      this_00 = (ASOperand2 *)__dynamic_cast(*ppAVar2,&typeinfo,&ASOperand2::typeinfo,0);
      if (this_00 == (ASOperand2 *)0x0) goto LAB_0016b0c3;
      pAVar1 = ASOperand2::getRm(this_00);
      if (pAVar1 != (ASValue *)0x0) {
        local_50 = ASOperand2::getRm(this_00);
        std::vector<ASValue*,std::allocator<ASValue*>>::emplace_back<ASValue*>
                  ((vector<ASValue*,std::allocator<ASValue*>> *)__return_storage_ptr__,&local_50);
      }
      pAVar1 = ASOperand2::getRs(this_00);
      if (pAVar1 != (ASValue *)0x0) {
        local_50 = ASOperand2::getRs(this_00);
        std::vector<ASValue*,std::allocator<ASValue*>>::emplace_back<ASValue*>
                  ((vector<ASValue*,std::allocator<ASValue*>> *)__return_storage_ptr__,&local_50);
      }
    }
    ppAVar2 = ppAVar2 + 1;
  } while( true );
}

Assistant:

std::vector<ASValue *> ASValue::getOperandsWithOp2() {
    std::vector<ASValue *> val;
    for (auto i : getOperands()) {
        if (auto op2 = dynamic_cast<ASOperand2 *>(i)) {
            if (op2->getRm()) {
                val.push_back(op2->getRm());
            }
            if (op2->getRs()) {
                val.push_back(op2->getRs());
            }
        } else {
            val.push_back(op2);
        }
    }
    return val;
}